

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O0

int Unr_ManFanin0Value(Unr_Man_t *p,Unr_Obj_t *pObj)

{
  int iVar1;
  Unr_Obj_t *pUVar2;
  int Index;
  Unr_Obj_t *pFanin;
  Unr_Obj_t *pObj_local;
  Unr_Man_t *p_local;
  
  pUVar2 = Unr_ManObj(p,pObj->hFan0);
  if (((uint)((ulong)*(undefined8 *)&pUVar2->field_0x8 >> 0x22) & 0x7fff) <=
      (uint)((ulong)*(undefined8 *)&pUVar2->field_0x8 >> 0x31)) {
    __assert_fail("pFanin->RankCur < pFanin->RankMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                  ,0x4c,"int Unr_ManFanin0Value(Unr_Man_t *, Unr_Obj_t *)");
  }
  if (((uint)(*(ulong *)&pObj->field_0x8 >> 2) & 0x7fff) <
      ((uint)((ulong)*(undefined8 *)&pUVar2->field_0x8 >> 0x22) & 0x7fff)) {
    iVar1 = Abc_LitNotCond(pUVar2->Res
                           [(int)(((uint)((ulong)*(undefined8 *)&pUVar2->field_0x8 >> 0x31) +
                                  ((uint)((ulong)*(undefined8 *)&pUVar2->field_0x8 >> 0x22) & 0x7fff
                                  )) - ((uint)(*(ulong *)&pObj->field_0x8 >> 2) & 0x7fff)) %
                            (int)((uint)((ulong)*(undefined8 *)&pUVar2->field_0x8 >> 0x22) & 0x7fff)
                           ],(uint)*(undefined8 *)&pObj->field_0x8 & 1);
    return iVar1;
  }
  __assert_fail("pObj->uRDiff0 < pFanin->RankMax",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                ,0x4d,"int Unr_ManFanin0Value(Unr_Man_t *, Unr_Obj_t *)");
}

Assistant:

static inline int Unr_ManFanin0Value( Unr_Man_t * p, Unr_Obj_t * pObj )
{
    Unr_Obj_t * pFanin = Unr_ManObj( p, pObj->hFan0 );
    int Index = (pFanin->RankCur + pFanin->RankMax - pObj->uRDiff0) % pFanin->RankMax;
    assert( pFanin->RankCur < pFanin->RankMax );
    assert( pObj->uRDiff0 < pFanin->RankMax );
    return Abc_LitNotCond( pFanin->Res[Index], pObj->fCompl0 );
}